

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidTrimGeometry(ON_Brep *this,int trim_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepTrim *trim;
  ON_TextLog *text_log_local;
  int trim_index_local;
  ON_Brep *this_local;
  
  if ((-1 < trim_index) &&
     (iVar1 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
     trim_index < iVar1)) {
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim_index);
    if (pOVar3->m_trim_index != trim_index) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_trim_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar3->m_trim_index,(ulong)(uint)trim_index);
        ON_TextLog::PopIndent(text_log);
      }
      return false;
    }
    return true;
  }
  if (text_log != (ON_TextLog *)0x0) {
    uVar2 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
    ON_TextLog::Print(text_log,"brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count() ).\n",
                      (ulong)(uint)trim_index,(ulong)uVar2);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidTrimGeometry( int trim_index, ON_TextLog* text_log ) const
{
  if ( trim_index < 0 || trim_index >= m_T.Count() )
  {
    if ( text_log )
      text_log->Print("brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count() ).\n",
                      trim_index, m_T.Count());
    return false;
  }
  const ON_BrepTrim& trim = m_T[trim_index];
  if ( trim.m_trim_index != trim_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_trim_index = %d (should be %d).\n",
                       trim.m_trim_index, trim_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}